

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O1

ibuf * ibuf_dynamic(size_t len,size_t max)

{
  ibuf *piVar1;
  
  if (max < len) {
    return (ibuf *)0x0;
  }
  piVar1 = ibuf_open(len);
  if (piVar1 == (ibuf *)0x0) {
    piVar1 = (ibuf *)0x0;
  }
  else if (max != 0) {
    piVar1->max = max;
  }
  return piVar1;
}

Assistant:

struct ibuf *
ibuf_dynamic(size_t len, size_t max)
{
	struct ibuf	*buf;

	if (max < len)
		return (NULL);

	if ((buf = ibuf_open(len)) == NULL)
		return (NULL);

	if (max > 0)
		buf->max = max;

	return (buf);
}